

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O3

void __thiscall MuHash3072::MuHash3072(MuHash3072 *this,Span<const_unsigned_char> in)

{
  MuHash3072 *this_00;
  long in_FS_OFFSET;
  Num3072 NStack_1a8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_numerator).limbs[0] = 1;
  memset((this->m_numerator).limbs + 1,0,0x178);
  (this->m_denominator).limbs[0] = 1;
  this_00 = (MuHash3072 *)0x0;
  memset((this->m_denominator).limbs + 1,0,0x178);
  ToNum3072(&NStack_1a8,this_00,in);
  memcpy(this,&NStack_1a8,0x180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

MuHash3072::MuHash3072(Span<const unsigned char> in) noexcept
{
    m_numerator = ToNum3072(in);
}